

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float128_rem_m68k(float128 a,float128 b,float_status *status)

{
  int iVar1;
  float128 fVar2;
  uint64_t uVar3;
  ulong uVar4;
  byte bVar5;
  char cVar6;
  uint64_t zSig1;
  long lVar7;
  uint64_t zSig0;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong b_00;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  int32_t bExp;
  ulong local_90;
  uint64_t term1;
  ulong local_80;
  uint64_t term2;
  int32_t local_70;
  int32_t aExp;
  uint64_t term0;
  uint64_t local_60;
  ulong local_58;
  uint64_t local_50;
  ulong local_48;
  float_status *local_40;
  ulong local_38;
  
  local_60 = b.low;
  uVar3 = a.low;
  uVar12 = a.high & 0xffffffffffff;
  uVar9 = a.high._6_2_ & 0x7fff;
  local_58 = b.high & 0xffffffffffff;
  bExp = b.high._6_2_ & 0x7fff;
  aExp = uVar9;
  local_50 = uVar3;
  local_48 = uVar12;
  if (uVar9 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
         uVar3 == 0) &&
       (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_60 == 0 || bExp != 0x7fff)) {
LAB_00652af8:
      status->float_exception_flags = status->float_exception_flags | 1;
      fVar2.high = 0x7fffffffffffffff;
      fVar2.low = 0xffffffffffffffff;
      return fVar2;
    }
LAB_0065295d:
    a = propagateFloat128NaN(a,b,status);
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_60 == 0) goto LAB_00652af8;
      normalizeFloat128Subnormal(local_58,local_60,&bExp,&local_58,&local_60);
    }
    else if (bExp == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_60 == 0) {
        return a;
      }
      goto LAB_0065295d;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          uVar3 == 0) {
        return a;
      }
      normalizeFloat128Subnormal(uVar12,uVar3,&aExp,&local_48,&local_50);
      uVar9 = aExp;
    }
    iVar10 = uVar9 - bExp;
    if (-2 < iVar10) {
      bVar5 = iVar10 == -1 ^ 0xf;
      uVar8 = local_50 << bVar5;
      uVar13 = local_50 >> ((iVar10 == -1) + 0x31U & 0x3f) | (local_48 | 0x1000000000000) << bVar5;
      local_80 = local_60 * 0x8000;
      b_00 = local_58 << 0xf | local_60 >> 0x31 | 0x8000000000000000;
      uVar12 = (ulong)(local_80 <= uVar8 && uVar13 == b_00 || b_00 < uVar13);
      local_70 = bExp;
      if (local_80 <= uVar8 && uVar13 == b_00 || b_00 < uVar13) {
        bVar14 = uVar8 < local_80;
        uVar8 = uVar8 + local_60 * -0x8000;
        uVar13 = (uVar13 - b_00) - (ulong)bVar14;
      }
      local_90 = local_60 >> 0x31;
      local_40 = status;
      local_38 = a.high;
      for (; iVar1 = iVar10 + -0x40, 0 < iVar1; iVar10 = iVar10 + -0x3d) {
        uVar3 = estimateDiv128To64(uVar13,uVar8,b_00);
        uVar12 = uVar3 - 4;
        if (uVar3 < 4) {
          uVar12 = 0;
        }
        mul128By64To192(b_00,local_80,uVar12,&term0,&term1,&term2);
        uVar11 = uVar8 >> 3;
        uVar4 = term0 << 0x3d | term1 >> 3;
        term2 = term2 >> 3 | term1 << 0x3d;
        uVar8 = -term2;
        uVar13 = ((uVar13 << 0x3d | uVar11) - uVar4) - (ulong)(term2 != 0);
        term1 = uVar4;
      }
      if (iVar1 < -0x3f) {
        uVar8 = uVar8 >> 0xc | uVar13 << 0x34;
        uVar3 = uVar13 >> 0xc;
        uVar11 = local_90 << 0x34 | local_80 >> 0xc;
      }
      else {
        uVar3 = estimateDiv128To64(uVar13,uVar8,b_00);
        uVar12 = 0;
        if (3 < uVar3) {
          uVar12 = uVar3 - 4;
        }
        cVar6 = (char)iVar10;
        uVar12 = uVar12 >> (-cVar6 & 0x3fU);
        uVar11 = local_90 << 0x34 | local_80 >> 0xc;
        bVar5 = cVar6 - 0xc;
        if (iVar1 < -0x34) {
          uVar4 = uVar8 >> (0xcU - cVar6 & 0x3f) | uVar13 << (bVar5 & 0x3f);
          uVar13 = uVar13 >> (0xcU - cVar6 & 0x3f);
        }
        else {
          uVar4 = uVar8 << (bVar5 & 0x3f);
          if (iVar10 != 0xc) {
            uVar13 = uVar13 << (bVar5 & 0x3f) | uVar8 >> (0x4cU - cVar6 & 0x3f);
          }
        }
        local_90 = uVar11;
        mul128By64To192(b_00 >> 0xc,uVar11,uVar12,&term0,&term1,&term2);
        uVar8 = uVar4 - term2;
        uVar3 = (uVar13 - term1) - (ulong)(uVar4 < term2);
      }
      zSig1 = uVar11 + uVar8;
      uVar13 = uVar11 + uVar8 * 2;
      uVar12 = uVar12 - 1;
      do {
        zSig0 = uVar3;
        uVar13 = uVar13 + uVar11 * -2;
        zSig1 = zSig1 - uVar11;
        uVar12 = uVar12 + 1;
        bVar14 = uVar8 < uVar11;
        uVar8 = uVar8 - uVar11;
        uVar3 = (zSig0 - (b_00 >> 0xc)) - (ulong)bVar14;
      } while (-1 < (long)uVar3);
      lVar7 = uVar3 + zSig0 + (ulong)(uVar13 < uVar8);
      if (((-1 < lVar7) && ((uVar12 & 1) != 0 || (lVar7 != 0 || uVar13 != 0))) ||
         (uVar3 = zSig0, uVar8 = zSig1, (long)zSig0 < 0)) {
        zSig1 = -uVar8;
        zSig0 = -uVar3 - (ulong)(uVar8 != 0);
      }
      a = normalizeRoundAndPackFloat128
                    ((byte)((byte)(uVar3 >> 0x38) ^ (byte)(local_38 >> 0x38)) >> 7,local_70 + -4,
                     zSig0,zSig1,local_40);
    }
  }
  return a;
}

Assistant:

float128 float128_rem(float128 a, float128 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig0, bSig1, q, term0, term1, term2;
    uint64_t allZero, alternateASig0, alternateASig1, sigMean1;
    int64_t sigMean0;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return a;
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    expDiff = aExp - bExp;
    if ( expDiff < -1 ) return a;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000),
        aSig1,
        15 - ( expDiff < 0 ),
        &aSig0,
        &aSig1
    );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    q = le128( bSig0, bSig1, aSig0, aSig1 );
    if ( q ) sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        shortShift192Left( term0, term1, term2, 61, &term1, &term2, &allZero );
        shortShift128Left( aSig0, aSig1, 61, &aSig0, &allZero );
        sub128( aSig0, 0, term1, term2, &aSig0, &aSig1 );
        expDiff -= 61;
    }
    if ( -64 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        q >>= - expDiff;
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
        expDiff += 52;
        if ( expDiff < 0 ) {
            shift128Right( aSig0, aSig1, - expDiff, &aSig0, &aSig1 );
        }
        else {
            shortShift128Left( aSig0, aSig1, expDiff, &aSig0, &aSig1 );
        }
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        sub128( aSig0, aSig1, term1, term2, &aSig0, &aSig1 );
    }
    else {
        shift128Right( aSig0, aSig1, 12, &aSig0, &aSig1 );
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
    }
    do {
        alternateASig0 = aSig0;
        alternateASig1 = aSig1;
        ++q;
        sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    } while ( 0 <= (int64_t) aSig0 );
    add128(
        aSig0, aSig1, alternateASig0, alternateASig1, (uint64_t *)&sigMean0, &sigMean1 );
    if (    ( sigMean0 < 0 )
         || ( ( ( sigMean0 | sigMean1 ) == 0 ) && ( q & 1 ) ) ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
    }
    zSign = ( (int64_t) aSig0 < 0 );
    if ( zSign ) sub128( 0, 0, aSig0, aSig1, &aSig0, &aSig1 );
    return normalizeRoundAndPackFloat128(aSign ^ zSign, bExp - 4, aSig0, aSig1,
                                         status);
}